

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

TypeArray *
soul::AST::CommaSeparatedList::getListOfResultTypes
          (TypeArray *__return_storage_ptr__,pool_ptr<soul::AST::Expression> *expressionOrList)

{
  Type *pTVar1;
  Type *pTVar2;
  size_t sVar3;
  pool_ref<soul::AST::Expression> *ppVar4;
  long lVar5;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> list;
  undefined4 local_80;
  Primitive local_7c;
  undefined8 local_78;
  Structure *local_70;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_68;
  pool_ptr<soul::AST::Expression> local_30;
  
  __return_storage_ptr__->items = (Type *)__return_storage_ptr__->space;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 8;
  local_30 = (pool_ptr<soul::AST::Expression>)expressionOrList->object;
  getAsExpressionList(&local_68,&local_30);
  ArrayWithPreallocation<soul::Type,_8UL>::reserve(__return_storage_ptr__,local_68.numActive);
  ppVar4 = local_68.items;
  if (local_68.numActive != 0) {
    lVar5 = 0;
    do {
      (**(code **)(**(long **)((long)&ppVar4->object + lVar5) + 0x20))(&local_80);
      ArrayWithPreallocation<soul::Type,_8UL>::reserve
                (__return_storage_ptr__,__return_storage_ptr__->numActive + 1);
      pTVar2 = __return_storage_ptr__->items;
      sVar3 = __return_storage_ptr__->numActive;
      pTVar1 = pTVar2 + sVar3;
      pTVar1->category = (undefined1)local_80;
      pTVar1->arrayElementCategory = local_80._1_1_;
      pTVar1->isRef = (bool)local_80._2_1_;
      pTVar1->isConstant = (bool)local_80._3_1_;
      pTVar2[sVar3].primitiveType.type = local_7c;
      pTVar2[sVar3].boundingSize = (undefined4)local_78;
      pTVar2[sVar3].arrayElementBoundingSize = local_78._4_4_;
      pTVar2[sVar3].structure.object = local_70;
      local_70 = (Structure *)0x0;
      __return_storage_ptr__->numActive = __return_storage_ptr__->numActive + 1;
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
      lVar5 = lVar5 + 8;
    } while (local_68.numActive << 3 != lVar5);
  }
  local_68.numActive = 0;
  if ((4 < local_68.numAllocated) && (local_68.items != (pool_ref<soul::AST::Expression> *)0x0)) {
    operator_delete__(local_68.items);
  }
  return __return_storage_ptr__;
}

Assistant:

static TypeArray getListOfResultTypes (pool_ptr<Expression> expressionOrList)
        {
            TypeArray types;
            auto list = getAsExpressionList (expressionOrList);
            types.reserve (list.size());

            for (auto& i : list)
                types.push_back (i->getResultType());

            return types;
        }